

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

ArgMaxParameter * __thiscall caffe::ArgMaxParameter::New(ArgMaxParameter *this,Arena *arena)

{
  ArgMaxParameter *this_00;
  
  this_00 = (ArgMaxParameter *)operator_new(0x28);
  ArgMaxParameter(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<caffe::ArgMaxParameter>(arena,this_00);
  }
  return this_00;
}

Assistant:

ArgMaxParameter* ArgMaxParameter::New(::google::protobuf::Arena* arena) const {
  ArgMaxParameter* n = new ArgMaxParameter;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}